

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_create_array_iterator(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  JSValueUnion JVar2;
  JSValue *pJVar3;
  JSClassID class_id;
  JSRefCountHeader *p_1;
  JSValue v;
  JSValue JVar4;
  
  if ((magic & 4U) == 0) {
    v = JS_ToObject(ctx,this_val);
    class_id = 0x25;
  }
  else {
    v = JS_ToStringCheckObject(ctx,this_val);
    class_id = 0x26;
  }
  if ((uint)v.tag != 6) {
    JVar4.tag = *(int64_t *)((long)&ctx->class_proto->tag + (ulong)(class_id << 4));
    JVar4.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto->u + (ulong)(class_id << 4)))->ptr;
    JVar4 = JS_NewObjectProtoClass(ctx,JVar4,class_id);
    JVar2 = JVar4.u;
    if ((JVar4.tag & 0xffffffffU) != 6) {
      pJVar3 = (JSValue *)js_malloc(ctx,0x18);
      if (pJVar3 != (JSValue *)0x0) {
        *pJVar3 = v;
        pJVar3[1].u.int32 = magic & 3;
        *(undefined4 *)((long)&pJVar3[1].u + 4) = 0;
        if ((uint)JVar4.tag != 0xffffffff) {
          return JVar4;
        }
        *(JSValue **)((long)JVar2.ptr + 0x30) = pJVar3;
        return JVar4;
      }
      if ((0xfffffff4 < (uint)JVar4.tag) &&
         (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar4);
      }
    }
  }
  if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_create_array_iterator(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv, int magic)
{
    JSValue enum_obj, arr;
    JSArrayIteratorData *it;
    JSIteratorKindEnum kind;
    int class_id;

    kind = magic & 3;
    if (magic & 4) {
        /* string iterator case */
        arr = JS_ToStringCheckObject(ctx, this_val);
        class_id = JS_CLASS_STRING_ITERATOR;
    } else {
        arr = JS_ToObject(ctx, this_val);
        class_id = JS_CLASS_ARRAY_ITERATOR;
    }
    if (JS_IsException(arr))
        goto fail;
    enum_obj = JS_NewObjectClass(ctx, class_id);
    if (JS_IsException(enum_obj))
        goto fail;
    it = js_malloc(ctx, sizeof(*it));
    if (!it)
        goto fail1;
    it->obj = arr;
    it->kind = kind;
    it->idx = 0;
    JS_SetOpaque(enum_obj, it);
    return enum_obj;
 fail1:
    JS_FreeValue(ctx, enum_obj);
 fail:
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}